

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ManIncrementTravId(Gia_Man_t *p)

{
  int *piVar1;
  int iVar2;
  size_t __nmemb;
  long lVar3;
  
  piVar1 = p->pTravIds;
  if (piVar1 == (int *)0x0) {
    __nmemb = (long)p->nObjs + 100;
    p->nTravIdsAlloc = (int)__nmemb;
    piVar1 = (int *)calloc(__nmemb,4);
    p->pTravIds = piVar1;
    p->nTravIds = 0;
  }
  else {
    iVar2 = p->nTravIdsAlloc;
    if (iVar2 < p->nObjs) {
      do {
        iVar2 = iVar2 * 2;
        p->nTravIdsAlloc = iVar2;
        lVar3 = (long)iVar2;
        if (piVar1 == (int *)0x0) {
          piVar1 = (int *)malloc(lVar3 * 4);
        }
        else {
          piVar1 = (int *)realloc(piVar1,lVar3 * 4);
          iVar2 = p->nTravIdsAlloc;
          lVar3 = (long)iVar2;
        }
        p->pTravIds = piVar1;
        memset(piVar1 + iVar2 / 2,0,lVar3 * 2 & 0x7ffffffffffffffe);
      } while (iVar2 < p->nObjs);
    }
  }
  p->nTravIds = p->nTravIds + 1;
  return;
}

Assistant:

void Gia_ManIncrementTravId( Gia_Man_t * p )                     
{ 
    if ( p->pTravIds == NULL )
    {
        p->nTravIdsAlloc = Gia_ManObjNum(p) + 100; 
        p->pTravIds = ABC_CALLOC( int, p->nTravIdsAlloc ); 
        p->nTravIds = 0;  
    }
    while ( p->nTravIdsAlloc < Gia_ManObjNum(p) )
    {
        p->nTravIdsAlloc *= 2;
        p->pTravIds = ABC_REALLOC( int, p->pTravIds, p->nTravIdsAlloc );
        memset( p->pTravIds + p->nTravIdsAlloc/2, 0, sizeof(int) * p->nTravIdsAlloc/2 );
    }
    p->nTravIds++;                                                    
}